

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::GroupNorm_x86_fma::forward_inplace(GroupNorm_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  float *pfVar8;
  uint uVar9;
  long lVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [32];
  ulong uVar26;
  long lVar27;
  uint *puVar28;
  __m128 x64;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar130;
  float fVar131;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar134 [32];
  undefined1 auVar136 [32];
  undefined1 auVar157 [32];
  
  auVar6 = _DAT_00596ee0;
  auVar5 = _DAT_00596ec0;
  iVar13 = bottom_top_blob->dims;
  uVar17 = (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_GroupNorm_x86_fma[-3]) /
           (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_GroupNorm_x86_fma[-3]);
  uVar16 = uVar17 & 0xffffffff;
  uVar9 = (uint)uVar17;
  auVar79 = in_ZMM5._0_16_;
  if (iVar13 == 2) {
    pp_Var1 = this->_vptr_GroupNorm_x86_fma;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar18 = bottom_top_blob->w;
      uVar20 = uVar18 * uVar9;
      uVar14 = uVar20 & 0xfffffff8;
      lVar22 = 0;
      auVar77._8_8_ = 0x8000000000000000;
      auVar77._0_8_ = 0x8000000000000000;
      auVar79 = vpcmpeqd_avx(auVar79,auVar79);
      do {
        lVar10 = lVar22 * (int)uVar9;
        pauVar25 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar10 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar140 = 0.0;
        fVar142 = 0.0;
        fVar130 = 0.0;
        fVar138 = 0.0;
        fVar144 = 0.0;
        fVar146 = 0.0;
        fVar148 = 0.0;
        fVar150 = 0.0;
        pauVar11 = pauVar25;
        uVar21 = 0;
        fVar131 = 0.0;
        fVar139 = 0.0;
        fVar141 = 0.0;
        fVar143 = 0.0;
        fVar145 = 0.0;
        fVar147 = 0.0;
        fVar149 = 0.0;
        fVar151 = 0.0;
        if (7 < (int)uVar20) {
          iVar13 = 7;
          do {
            fVar130 = fVar130 + *(float *)*pauVar11;
            fVar138 = fVar138 + *(float *)(*pauVar11 + 4);
            fVar140 = fVar140 + *(float *)(*pauVar11 + 8);
            fVar142 = fVar142 + *(float *)(*pauVar11 + 0xc);
            fVar144 = fVar144 + *(float *)(*pauVar11 + 0x10);
            fVar146 = fVar146 + *(float *)(*pauVar11 + 0x14);
            fVar148 = fVar148 + *(float *)(*pauVar11 + 0x18);
            fVar150 = fVar150 + *(float *)(*pauVar11 + 0x1c);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar21 = uVar14;
            fVar131 = fVar130;
            fVar139 = fVar138;
            fVar141 = fVar140;
            fVar143 = fVar142;
            fVar145 = fVar144;
            fVar147 = fVar146;
            fVar149 = fVar148;
            fVar151 = fVar150;
          } while (iVar13 < (int)uVar20);
        }
        uVar15 = uVar21 | 3;
        auVar67 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar140 = auVar67._4_4_;
          fVar142 = auVar67._8_4_;
          fVar130 = auVar67._12_4_;
          if ((int)uVar20 <= (int)uVar15) break;
          auVar67._0_4_ = auVar67._0_4_ + *(float *)*pauVar11;
          auVar67._4_4_ = fVar140 + *(float *)(*pauVar11 + 4);
          auVar67._8_4_ = fVar142 + *(float *)(*pauVar11 + 8);
          auVar67._12_4_ = fVar130 + *(float *)(*pauVar11 + 0xc);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar15 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        auVar90._0_4_ = fVar131 + fVar145;
        auVar90._4_4_ = fVar139 + fVar147;
        auVar90._8_4_ = fVar141 + fVar149;
        auVar90._12_4_ = fVar143 + fVar151;
        auVar69 = vshufpd_avx(auVar90,auVar90,1);
        auVar91._0_4_ = auVar69._0_4_ + auVar90._0_4_;
        auVar91._4_4_ = auVar69._4_4_ + auVar90._4_4_;
        auVar91._8_4_ = auVar69._8_4_ + auVar90._8_4_;
        auVar91._12_4_ = auVar69._12_4_ + auVar90._12_4_;
        auVar69 = vshufpd_avx(auVar67,auVar67,1);
        auVar68._0_4_ = auVar69._0_4_ + auVar67._0_4_;
        auVar68._4_4_ = auVar69._4_4_ + fVar140;
        auVar68._8_4_ = auVar69._8_4_ + fVar142;
        auVar68._12_4_ = auVar69._12_4_ + fVar130;
        auVar67 = vhaddps_avx(auVar91,auVar91);
        auVar69 = vmovshdup_avx(auVar68);
        fVar140 = auVar67._0_4_ + auVar69._0_4_ + auVar68._0_4_;
        if ((int)uVar21 < (int)uVar20) {
          uVar17 = CONCAT44(0,~uVar21 + uVar20);
          auVar67 = vblendps_avx(ZEXT416((uint)fVar140),_DAT_00594040,0xe);
          auVar69._8_8_ = 0;
          auVar69._0_8_ = uVar17;
          auVar90 = vpshufd_avx(auVar69,0x44);
          auVar69 = vorps_avx(auVar90,auVar77);
          auVar68 = vorps_avx(auVar90,auVar77);
          uVar16 = 0;
          auVar160 = ZEXT1664(auVar67);
          do {
            auVar161 = auVar160;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = uVar16;
            auVar67 = vpshufd_avx(auVar92,0x44);
            auVar104._16_16_ = auVar67;
            auVar104._0_16_ = auVar67;
            auVar163 = vorps_avx(auVar104,auVar5);
            auVar104 = vorps_avx(auVar104,auVar6);
            auVar67 = vorps_avx(auVar90,auVar77);
            auVar115._8_4_ = auVar104._24_4_;
            auVar115._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
            auVar115._12_4_ = auVar104._28_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar115,auVar67);
            auVar93._8_4_ = auVar104._8_4_;
            auVar167._8_4_ = auVar93._8_4_;
            auVar167._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
            auVar167._12_4_ = auVar104._12_4_ ^ 0x80000000;
            auVar91 = vpcmpgtq_avx(auVar167,auVar69);
            auVar91 = vpackssdw_avx(auVar91,auVar92);
            auVar174._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
            auVar174._8_4_ = auVar163._24_4_;
            auVar174._12_4_ = auVar163._28_4_ ^ 0x80000000;
            auVar115 = vpcmpgtq_avx(auVar174,auVar67);
            auVar175._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
            auVar175._8_4_ = auVar163._8_4_;
            auVar175._12_4_ = auVar163._12_4_ ^ 0x80000000;
            auVar67 = vpcmpgtq_avx(auVar175,auVar68);
            auVar67 = vpackssdw_avx(auVar67,auVar115);
            auVar67 = vpackssdw_avx(auVar67 ^ auVar79,auVar91 ^ auVar79);
            auVar91 = vpmovsxwd_avx(auVar67);
            auVar67 = vpunpckhwd_avx(auVar67,auVar67);
            auVar171._16_16_ = auVar67;
            auVar171._0_16_ = auVar91;
            auVar171 = vmaskmovps_avx(auVar171,*(undefined1 (*) [32])(*pauVar11 + uVar16 * 4));
            auVar133._0_4_ = auVar171._0_4_ + auVar161._0_4_;
            auVar133._4_4_ = auVar171._4_4_ + auVar161._4_4_;
            auVar133._8_4_ = auVar171._8_4_ + auVar161._8_4_;
            auVar133._12_4_ = auVar171._12_4_ + auVar161._12_4_;
            auVar136._16_4_ = auVar171._16_4_ + auVar161._16_4_;
            auVar136._0_16_ = auVar133;
            auVar136._20_4_ = auVar171._20_4_ + auVar161._20_4_;
            auVar136._24_4_ = auVar171._24_4_ + auVar161._24_4_;
            auVar136._28_4_ = auVar171._28_4_ + auVar161._28_4_;
            uVar16 = uVar16 + 8;
            auVar160 = ZEXT3264(auVar136);
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar16);
          auVar67 = vorps_avx(auVar90,auVar77);
          auVar93._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
          auVar93._12_4_ = auVar104._12_4_ ^ 0x80000000;
          auVar67 = vpcmpgtq_avx(auVar93,auVar67);
          auVar69 = vpackssdw_avx(auVar67,auVar92);
          auVar67 = vorps_avx(auVar90,auVar77);
          auVar116._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
          auVar116._8_4_ = auVar163._8_4_;
          auVar116._12_4_ = auVar163._12_4_ ^ 0x80000000;
          auVar67 = vpcmpgtq_avx(auVar116,auVar67);
          auVar67 = vpackssdw_avx(auVar67,auVar115);
          auVar67 = vblendvps_avx(auVar161._0_16_,auVar133,auVar67 ^ auVar79);
          auVar69 = vblendvps_avx(auVar161._16_16_,auVar136._16_16_,auVar69 ^ auVar79);
          auVar67 = vhaddps_avx(auVar69,auVar67);
          auVar67 = vhaddps_avx(auVar67,auVar67);
          auVar67 = vhaddps_avx(auVar67,auVar67);
          fVar140 = auVar67._0_4_;
        }
        fVar140 = (1.0 / (float)(int)uVar20) * fVar140;
        auVar67 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
        pauVar11 = pauVar25;
        if ((int)uVar20 < 8) {
          auVar163 = SUB6432(ZEXT864(0),0);
          uVar21 = 0;
        }
        else {
          auVar105._16_16_ = auVar67;
          auVar105._0_16_ = auVar67;
          auVar160 = ZEXT864(0);
          iVar13 = 7;
          do {
            auVar163 = vsubps_avx(*pauVar11,auVar105);
            auVar69 = vfmadd231ps_fma(auVar160._0_32_,auVar163,auVar163);
            auVar160 = ZEXT1664(auVar69);
            auVar163 = ZEXT1632(auVar69);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar21 = uVar14;
          } while (iVar13 < (int)uVar20);
        }
        auVar69 = ZEXT816(0) << 0x40;
        uVar15 = uVar21 | 3;
        while ((int)uVar15 < (int)uVar20) {
          auVar68 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar67);
          auVar69 = vfmadd231ps_fma(auVar69,auVar68,auVar68);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar15 = uVar21 + 7;
          uVar21 = uVar21 + 4;
        }
        auVar94._0_4_ = auVar163._0_4_ + auVar163._16_4_;
        auVar94._4_4_ = auVar163._4_4_ + auVar163._20_4_;
        auVar94._8_4_ = auVar163._8_4_ + auVar163._24_4_;
        auVar94._12_4_ = auVar163._12_4_ + auVar163._28_4_;
        auVar68 = vshufpd_avx(auVar94,auVar94,1);
        auVar95._0_4_ = auVar68._0_4_ + auVar94._0_4_;
        auVar95._4_4_ = auVar68._4_4_ + auVar94._4_4_;
        auVar95._8_4_ = auVar68._8_4_ + auVar94._8_4_;
        auVar95._12_4_ = auVar68._12_4_ + auVar94._12_4_;
        auVar68 = vshufpd_avx(auVar69,auVar69,1);
        auVar117._0_4_ = auVar69._0_4_ + auVar68._0_4_;
        auVar117._4_4_ = auVar69._4_4_ + auVar68._4_4_;
        auVar117._8_4_ = auVar69._8_4_ + auVar68._8_4_;
        auVar117._12_4_ = auVar69._12_4_ + auVar68._12_4_;
        auVar69 = vhaddps_avx(auVar95,auVar95);
        auVar68 = vmovshdup_avx(auVar117);
        fVar142 = auVar68._0_4_ + auVar69._0_4_ + auVar117._0_4_;
        auVar69 = ZEXT416((uint)fVar142);
        if ((int)uVar21 < (int)uVar20) {
          uVar16 = CONCAT44(0,~uVar21 + uVar20);
          auVar69 = vblendps_avx(ZEXT416((uint)fVar142),_DAT_00594040,0xe);
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar16;
          auVar90 = vpshufd_avx(auVar96,0x44);
          auVar163._16_16_ = auVar67;
          auVar163._0_16_ = auVar67;
          auVar67 = vorps_avx(auVar90,auVar77);
          auVar68 = vorps_avx(auVar90,auVar77);
          uVar17 = 0;
          do {
            auVar93 = auVar69;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = uVar17;
            auVar69 = vpshufd_avx(auVar97,0x44);
            auVar106._16_16_ = auVar69;
            auVar106._0_16_ = auVar69;
            auVar104 = vorps_avx(auVar106,auVar5);
            auVar171 = vorps_avx(auVar106,auVar6);
            auVar69 = vorps_avx(auVar90,auVar77);
            auVar118._0_8_ = auVar171._16_8_ ^ 0x8000000000000000;
            auVar118._8_4_ = auVar171._24_4_;
            auVar118._12_4_ = auVar171._28_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar118,auVar69);
            auVar153._0_8_ = auVar171._0_8_ ^ 0x8000000000000000;
            auVar98._8_4_ = auVar171._8_4_;
            auVar153._8_4_ = auVar98._8_4_;
            auVar153._12_4_ = auVar171._12_4_ ^ 0x80000000;
            auVar91 = vpcmpgtq_avx(auVar153,auVar67);
            auVar91 = vpackssdw_avx(auVar91,auVar92);
            auVar34._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
            auVar34._8_4_ = auVar104._24_4_;
            auVar34._12_4_ = auVar104._28_4_ ^ 0x80000000;
            auVar115 = vpcmpgtq_avx(auVar34,auVar69);
            auVar35._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
            auVar35._8_4_ = auVar104._8_4_;
            auVar35._12_4_ = auVar104._12_4_ ^ 0x80000000;
            auVar69 = vpcmpgtq_avx(auVar35,auVar68);
            auVar69 = vpackssdw_avx(auVar69,auVar115);
            auVar69 = vpackssdw_avx(auVar69 ^ auVar79,auVar91 ^ auVar79);
            auVar91 = vpmovsxwd_avx(auVar69);
            auVar69 = vpunpckhwd_avx(auVar69,auVar69);
            auVar55._16_16_ = auVar69;
            auVar55._0_16_ = auVar91;
            auVar136 = vmaskmovps_avx(auVar55,*(undefined1 (*) [32])(*pauVar11 + uVar17 * 4));
            auVar136 = vsubps_avx(auVar136,auVar163);
            auVar69 = vfmadd213ps_fma(auVar136,auVar136,ZEXT1632(auVar93));
            uVar17 = uVar17 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar17);
          auVar67 = vorps_avx(auVar90,auVar77);
          auVar98._0_8_ = auVar171._0_8_ ^ 0x8000000000000000;
          auVar98._12_4_ = auVar171._12_4_ ^ 0x80000000;
          auVar67 = vpcmpgtq_avx(auVar98,auVar67);
          auVar68 = vpackssdw_avx(auVar67,auVar92);
          auVar67 = vorps_avx(auVar90,auVar77);
          auVar119._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
          auVar119._8_4_ = auVar104._8_4_;
          auVar119._12_4_ = auVar104._12_4_ ^ 0x80000000;
          auVar67 = vpcmpgtq_avx(auVar119,auVar67);
          auVar67 = vpackssdw_avx(auVar67,auVar115);
          auVar67 = vblendvps_avx(auVar93,auVar69,auVar67 ^ auVar79);
          auVar69 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar68 ^ auVar79);
          auVar67 = vhaddps_avx(auVar69,auVar67);
          auVar67 = vhaddps_avx(auVar67,auVar67);
          auVar69 = vhaddps_avx(auVar67,auVar67);
        }
        auVar69 = vfmadd213ss_fma(auVar69,ZEXT416((uint)(1.0 / (float)(int)uVar20)),
                                  ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var2)));
        auVar67 = vrsqrtss_avx(auVar69,auVar69);
        auVar69 = vfmadd213ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar67._0_4_)),auVar67,
                                  ZEXT416(0xc0400000));
        fVar142 = auVar67._0_4_ * -0.5 * auVar69._0_4_;
        fVar140 = fVar142 * -fVar140;
        if (*(int *)(&this->field_0xdc + (long)p_Var2) == 0) {
          auVar67 = vshufps_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),0);
          auVar69 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
          uVar21 = 0;
          if (7 < (int)uVar20) {
            auVar74._16_16_ = auVar67;
            auVar74._0_16_ = auVar67;
            auVar108._16_16_ = auVar69;
            auVar108._0_16_ = auVar69;
            iVar13 = 7;
            do {
              auVar68 = vfmadd132ps_fma(*pauVar25,auVar108,auVar74);
              *pauVar25 = ZEXT1632(auVar68);
              pauVar25 = pauVar25 + 1;
              iVar13 = iVar13 + 8;
              uVar21 = uVar14;
            } while (iVar13 < (int)uVar20);
          }
          uVar15 = uVar21 | 3;
          while ((int)uVar15 < (int)uVar20) {
            auVar68 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar69,auVar67);
            *(undefined1 (*) [16])*pauVar25 = auVar68;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
            uVar15 = uVar21 + 7;
            uVar21 = uVar21 + 4;
          }
          if ((int)uVar21 < (int)uVar20) {
            uVar16 = CONCAT44(0,~uVar21 + uVar20);
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar16;
            auVar68 = vpshufd_avx(auVar36,0x44);
            auVar156._16_16_ = auVar67;
            auVar156._0_16_ = auVar67;
            auVar137._16_16_ = auVar69;
            auVar137._0_16_ = auVar69;
            auVar67 = vorps_avx(auVar68,auVar77);
            auVar69 = vorps_avx(auVar68,auVar77);
            uVar17 = 0;
            do {
              auVar37._8_8_ = 0;
              auVar37._0_8_ = uVar17;
              auVar90 = vpshufd_avx(auVar37,0x44);
              auVar56._16_16_ = auVar90;
              auVar56._0_16_ = auVar90;
              auVar163 = vorps_avx(auVar56,auVar5);
              auVar104 = vorps_avx(auVar56,auVar6);
              auVar90 = vorps_avx(auVar68,auVar77);
              auVar126._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
              auVar126._8_4_ = auVar104._24_4_;
              auVar126._12_4_ = auVar104._28_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar126,auVar90);
              auVar38._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
              auVar38._8_4_ = auVar104._8_4_;
              auVar38._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar38,auVar67);
              auVar91 = vpackssdw_avx(auVar92,auVar91);
              auVar127._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
              auVar127._8_4_ = auVar163._24_4_;
              auVar127._12_4_ = auVar163._28_4_ ^ 0x80000000;
              auVar90 = vpcmpgtq_avx(auVar127,auVar90);
              auVar99._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
              auVar99._8_4_ = auVar163._8_4_;
              auVar99._12_4_ = auVar163._12_4_ ^ 0x80000000;
              auVar92 = vpcmpgtq_avx(auVar99,auVar69);
              auVar90 = vpackssdw_avx(auVar92,auVar90);
              auVar90 = vpackssdw_avx(auVar90 ^ auVar79,auVar91 ^ auVar79);
              auVar91 = vpmovsxwd_avx(auVar90);
              auVar90 = vpunpckhwd_avx(auVar90,auVar90);
              auVar57._16_16_ = auVar90;
              auVar57._0_16_ = auVar91;
              auVar163 = vmaskmovps_avx(auVar57,*(undefined1 (*) [32])(*pauVar25 + uVar17 * 4));
              auVar90 = vfmadd213ps_fma(auVar163,auVar156,auVar137);
              auVar163 = vmaskmovps_avx(auVar57,ZEXT1632(auVar90));
              *(undefined1 (*) [32])(*pauVar25 + uVar17 * 4) = auVar163;
              uVar17 = uVar17 + 8;
            } while ((uVar16 + 8 & 0x1fffffff8) != uVar17);
          }
        }
        else if (0 < (int)uVar9) {
          pfVar8 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar10 +
                            *(long *)(&this->field_0xe0 + (long)p_Var2));
          puVar28 = (uint *)(lVar10 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                            *(long *)(&this->field_0x128 + (long)p_Var2));
          uVar21 = 0;
          do {
            fVar131 = *pfVar8 * fVar142;
            auVar68 = vfmadd213ss_fma(ZEXT416((uint)*pfVar8),ZEXT416((uint)fVar140),
                                      ZEXT416(*puVar28));
            auVar67 = vshufps_avx(ZEXT416((uint)fVar131),ZEXT416((uint)fVar131),0);
            auVar69 = vshufps_avx(auVar68,auVar68,0);
            if ((int)uVar18 < 8) {
              uVar15 = 0;
            }
            else {
              auVar73._16_16_ = auVar67;
              auVar73._0_16_ = auVar67;
              auVar107._16_16_ = auVar69;
              auVar107._0_16_ = auVar69;
              iVar13 = 7;
              do {
                auVar90 = vfmadd132ps_fma(*pauVar25,auVar107,auVar73);
                *pauVar25 = ZEXT1632(auVar90);
                pauVar25 = pauVar25 + 1;
                iVar13 = iVar13 + 8;
                uVar15 = uVar18 & 0xfffffff8;
              } while (iVar13 < (int)uVar18);
            }
            uVar19 = uVar15 | 3;
            while ((int)uVar19 < (int)uVar18) {
              auVar90 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar69,auVar67);
              *(undefined1 (*) [16])*pauVar25 = auVar90;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
              uVar19 = uVar15 + 7;
              uVar15 = uVar15 + 4;
            }
            iVar13 = uVar18 - uVar15;
            if (iVar13 != 0 && (int)uVar15 <= (int)uVar18) {
              do {
                auVar67 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar25),auVar68,ZEXT416((uint)fVar131)
                                         );
                *(int *)*pauVar25 = auVar67._0_4_;
                pauVar25 = (undefined1 (*) [32])(*pauVar25 + 4);
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            pfVar8 = pfVar8 + 1;
            puVar28 = puVar28 + 1;
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar9);
        }
        lVar22 = lVar22 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar22 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  else if (iVar13 == 1) {
    pp_Var1 = this->_vptr_GroupNorm_x86_fma;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar18 = uVar9 & 0xfffffff8;
      lVar22 = 0;
      auVar76._8_8_ = 0x8000000000000000;
      auVar76._0_8_ = 0x8000000000000000;
      auVar79 = vpcmpeqd_avx(auVar79,auVar79);
      do {
        lVar10 = lVar22 * (int)uVar9;
        pauVar25 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar10 + (long)bottom_top_blob->data);
        fVar140 = 0.0;
        fVar142 = 0.0;
        fVar130 = 0.0;
        fVar138 = 0.0;
        fVar144 = 0.0;
        fVar146 = 0.0;
        fVar148 = 0.0;
        fVar150 = 0.0;
        pauVar11 = pauVar25;
        uVar20 = 0;
        fVar131 = 0.0;
        fVar139 = 0.0;
        fVar141 = 0.0;
        fVar143 = 0.0;
        fVar145 = 0.0;
        fVar147 = 0.0;
        fVar149 = 0.0;
        fVar151 = 0.0;
        if (7 < (int)uVar9) {
          iVar13 = 7;
          do {
            fVar130 = fVar130 + *(float *)*pauVar11;
            fVar138 = fVar138 + *(float *)(*pauVar11 + 4);
            fVar140 = fVar140 + *(float *)(*pauVar11 + 8);
            fVar142 = fVar142 + *(float *)(*pauVar11 + 0xc);
            fVar144 = fVar144 + *(float *)(*pauVar11 + 0x10);
            fVar146 = fVar146 + *(float *)(*pauVar11 + 0x14);
            fVar148 = fVar148 + *(float *)(*pauVar11 + 0x18);
            fVar150 = fVar150 + *(float *)(*pauVar11 + 0x1c);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar20 = uVar18;
            fVar131 = fVar130;
            fVar139 = fVar138;
            fVar141 = fVar140;
            fVar143 = fVar142;
            fVar145 = fVar144;
            fVar147 = fVar146;
            fVar149 = fVar148;
            fVar151 = fVar150;
          } while (iVar13 < (int)uVar9);
        }
        uVar14 = uVar20 | 3;
        auVar63 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar140 = auVar63._4_4_;
          fVar142 = auVar63._8_4_;
          fVar130 = auVar63._12_4_;
          if ((int)uVar9 <= (int)uVar14) break;
          auVar63._0_4_ = auVar63._0_4_ + *(float *)*pauVar11;
          auVar63._4_4_ = fVar140 + *(float *)(*pauVar11 + 4);
          auVar63._8_4_ = fVar142 + *(float *)(*pauVar11 + 8);
          auVar63._12_4_ = fVar130 + *(float *)(*pauVar11 + 0xc);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar14 = uVar20 + 7;
          uVar20 = uVar20 + 4;
        }
        auVar80._0_4_ = fVar131 + fVar145;
        auVar80._4_4_ = fVar139 + fVar147;
        auVar80._8_4_ = fVar141 + fVar149;
        auVar80._12_4_ = fVar143 + fVar151;
        auVar77 = vshufpd_avx(auVar80,auVar80,1);
        auVar81._0_4_ = auVar77._0_4_ + auVar80._0_4_;
        auVar81._4_4_ = auVar77._4_4_ + auVar80._4_4_;
        auVar81._8_4_ = auVar77._8_4_ + auVar80._8_4_;
        auVar81._12_4_ = auVar77._12_4_ + auVar80._12_4_;
        auVar77 = vshufpd_avx(auVar63,auVar63,1);
        auVar64._0_4_ = auVar77._0_4_ + auVar63._0_4_;
        auVar64._4_4_ = auVar77._4_4_ + fVar140;
        auVar64._8_4_ = auVar77._8_4_ + fVar142;
        auVar64._12_4_ = auVar77._12_4_ + fVar130;
        auVar77 = vhaddps_avx(auVar81,auVar81);
        auVar67 = vmovshdup_avx(auVar64);
        fVar140 = auVar77._0_4_ + auVar67._0_4_ + auVar64._0_4_;
        if ((int)uVar20 < (int)uVar9) {
          uVar17 = CONCAT44(0,~uVar20 + uVar9);
          auVar77 = vblendps_avx(ZEXT416((uint)fVar140),_DAT_00594040,0xe);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = uVar17;
          auVar68 = vpshufd_avx(auVar65,0x44);
          auVar67 = vorps_avx(auVar68,auVar76);
          auVar69 = vorps_avx(auVar68,auVar76);
          uVar16 = 0;
          auVar160 = ZEXT1664(auVar77);
          do {
            auVar161 = auVar160;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = uVar16;
            auVar77 = vpshufd_avx(auVar82,0x44);
            auVar101._16_16_ = auVar77;
            auVar101._0_16_ = auVar77;
            auVar163 = vorps_avx(auVar101,auVar5);
            auVar104 = vorps_avx(auVar101,auVar6);
            auVar77 = vorps_avx(auVar68,auVar76);
            auVar110._8_4_ = auVar104._24_4_;
            auVar110._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
            auVar110._12_4_ = auVar104._28_4_ ^ 0x80000000;
            auVar91 = vpcmpgtq_avx(auVar110,auVar77);
            auVar83._8_4_ = auVar104._8_4_;
            auVar166._8_4_ = auVar83._8_4_;
            auVar166._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
            auVar166._12_4_ = auVar104._12_4_ ^ 0x80000000;
            auVar90 = vpcmpgtq_avx(auVar166,auVar67);
            auVar90 = vpackssdw_avx(auVar90,auVar91);
            auVar172._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
            auVar172._8_4_ = auVar163._24_4_;
            auVar172._12_4_ = auVar163._28_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar172,auVar77);
            auVar173._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
            auVar173._8_4_ = auVar163._8_4_;
            auVar173._12_4_ = auVar163._12_4_ ^ 0x80000000;
            auVar77 = vpcmpgtq_avx(auVar173,auVar69);
            auVar77 = vpackssdw_avx(auVar77,auVar92);
            auVar77 = vpackssdw_avx(auVar77 ^ auVar79,auVar90 ^ auVar79);
            auVar90 = vpmovsxwd_avx(auVar77);
            auVar77 = vpunpckhwd_avx(auVar77,auVar77);
            auVar169._16_16_ = auVar77;
            auVar169._0_16_ = auVar90;
            auVar171 = vmaskmovps_avx(auVar169,*(undefined1 (*) [32])(*pauVar11 + uVar16 * 4));
            auVar132._0_4_ = auVar171._0_4_ + auVar161._0_4_;
            auVar132._4_4_ = auVar171._4_4_ + auVar161._4_4_;
            auVar132._8_4_ = auVar171._8_4_ + auVar161._8_4_;
            auVar132._12_4_ = auVar171._12_4_ + auVar161._12_4_;
            auVar134._16_4_ = auVar171._16_4_ + auVar161._16_4_;
            auVar134._0_16_ = auVar132;
            auVar134._20_4_ = auVar171._20_4_ + auVar161._20_4_;
            auVar134._24_4_ = auVar171._24_4_ + auVar161._24_4_;
            auVar134._28_4_ = auVar171._28_4_ + auVar161._28_4_;
            uVar16 = uVar16 + 8;
            auVar160 = ZEXT3264(auVar134);
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar16);
          auVar77 = vorps_avx(auVar68,auVar76);
          auVar83._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
          auVar83._12_4_ = auVar104._12_4_ ^ 0x80000000;
          auVar77 = vpcmpgtq_avx(auVar83,auVar77);
          auVar67 = vpackssdw_avx(auVar77,auVar91);
          auVar77 = vorps_avx(auVar68,auVar76);
          auVar111._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
          auVar111._8_4_ = auVar163._8_4_;
          auVar111._12_4_ = auVar163._12_4_ ^ 0x80000000;
          auVar77 = vpcmpgtq_avx(auVar111,auVar77);
          auVar77 = vpackssdw_avx(auVar77,auVar92);
          auVar77 = vblendvps_avx(auVar161._0_16_,auVar132,auVar77 ^ auVar79);
          auVar67 = vblendvps_avx(auVar161._16_16_,auVar134._16_16_,auVar67 ^ auVar79);
          auVar77 = vhaddps_avx(auVar67,auVar77);
          auVar77 = vhaddps_avx(auVar77,auVar77);
          auVar77 = vhaddps_avx(auVar77,auVar77);
          fVar140 = auVar77._0_4_;
        }
        fVar140 = (1.0 / (float)(int)uVar9) * fVar140;
        auVar77 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
        pauVar11 = pauVar25;
        if ((int)uVar9 < 8) {
          auVar163 = SUB6432(ZEXT864(0),0);
          uVar20 = 0;
        }
        else {
          auVar102._16_16_ = auVar77;
          auVar102._0_16_ = auVar77;
          auVar160 = ZEXT864(0);
          iVar13 = 7;
          do {
            auVar163 = vsubps_avx(*pauVar11,auVar102);
            auVar67 = vfmadd231ps_fma(auVar160._0_32_,auVar163,auVar163);
            auVar160 = ZEXT1664(auVar67);
            auVar163 = ZEXT1632(auVar67);
            pauVar11 = pauVar11 + 1;
            iVar13 = iVar13 + 8;
            uVar20 = uVar18;
          } while (iVar13 < (int)uVar9);
        }
        auVar67 = ZEXT816(0) << 0x40;
        uVar14 = uVar20 | 3;
        while ((int)uVar14 < (int)uVar9) {
          auVar69 = vsubps_avx(*(undefined1 (*) [16])*pauVar11,auVar77);
          auVar67 = vfmadd231ps_fma(auVar67,auVar69,auVar69);
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          uVar14 = uVar20 + 7;
          uVar20 = uVar20 + 4;
        }
        auVar84._0_4_ = auVar163._0_4_ + auVar163._16_4_;
        auVar84._4_4_ = auVar163._4_4_ + auVar163._20_4_;
        auVar84._8_4_ = auVar163._8_4_ + auVar163._24_4_;
        auVar84._12_4_ = auVar163._12_4_ + auVar163._28_4_;
        auVar69 = vshufpd_avx(auVar84,auVar84,1);
        auVar85._0_4_ = auVar69._0_4_ + auVar84._0_4_;
        auVar85._4_4_ = auVar69._4_4_ + auVar84._4_4_;
        auVar85._8_4_ = auVar69._8_4_ + auVar84._8_4_;
        auVar85._12_4_ = auVar69._12_4_ + auVar84._12_4_;
        auVar69 = vshufpd_avx(auVar67,auVar67,1);
        auVar112._0_4_ = auVar67._0_4_ + auVar69._0_4_;
        auVar112._4_4_ = auVar67._4_4_ + auVar69._4_4_;
        auVar112._8_4_ = auVar67._8_4_ + auVar69._8_4_;
        auVar112._12_4_ = auVar67._12_4_ + auVar69._12_4_;
        auVar67 = vhaddps_avx(auVar85,auVar85);
        auVar69 = vmovshdup_avx(auVar112);
        fVar142 = auVar69._0_4_ + auVar67._0_4_ + auVar112._0_4_;
        auVar67 = ZEXT416((uint)fVar142);
        if ((int)uVar20 < (int)uVar9) {
          uVar16 = CONCAT44(0,~uVar20 + uVar9);
          auVar67 = vblendps_avx(ZEXT416((uint)fVar142),_DAT_00594040,0xe);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar16;
          auVar68 = vpshufd_avx(auVar86,0x44);
          auVar162._16_16_ = auVar77;
          auVar162._0_16_ = auVar77;
          auVar77 = vorps_avx(auVar68,auVar76);
          auVar69 = vorps_avx(auVar68,auVar76);
          uVar17 = 0;
          do {
            auVar115 = auVar67;
            auVar87._8_8_ = 0;
            auVar87._0_8_ = uVar17;
            auVar67 = vpshufd_avx(auVar87,0x44);
            auVar103._16_16_ = auVar67;
            auVar103._0_16_ = auVar67;
            auVar163 = vorps_avx(auVar103,auVar5);
            auVar104 = vorps_avx(auVar103,auVar6);
            auVar67 = vorps_avx(auVar68,auVar76);
            auVar113._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
            auVar113._8_4_ = auVar104._24_4_;
            auVar113._12_4_ = auVar104._28_4_ ^ 0x80000000;
            auVar91 = vpcmpgtq_avx(auVar113,auVar67);
            auVar152._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
            auVar88._8_4_ = auVar104._8_4_;
            auVar152._8_4_ = auVar88._8_4_;
            auVar152._12_4_ = auVar104._12_4_ ^ 0x80000000;
            auVar90 = vpcmpgtq_avx(auVar152,auVar77);
            auVar90 = vpackssdw_avx(auVar90,auVar91);
            auVar29._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
            auVar29._8_4_ = auVar163._24_4_;
            auVar29._12_4_ = auVar163._28_4_ ^ 0x80000000;
            auVar92 = vpcmpgtq_avx(auVar29,auVar67);
            auVar30._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
            auVar30._8_4_ = auVar163._8_4_;
            auVar30._12_4_ = auVar163._12_4_ ^ 0x80000000;
            auVar67 = vpcmpgtq_avx(auVar30,auVar69);
            auVar67 = vpackssdw_avx(auVar67,auVar92);
            auVar67 = vpackssdw_avx(auVar67 ^ auVar79,auVar90 ^ auVar79);
            auVar90 = vpmovsxwd_avx(auVar67);
            auVar67 = vpunpckhwd_avx(auVar67,auVar67);
            auVar52._16_16_ = auVar67;
            auVar52._0_16_ = auVar90;
            auVar171 = vmaskmovps_avx(auVar52,*(undefined1 (*) [32])(*pauVar11 + uVar17 * 4));
            auVar171 = vsubps_avx(auVar171,auVar162);
            auVar67 = vfmadd213ps_fma(auVar171,auVar171,ZEXT1632(auVar115));
            uVar17 = uVar17 + 8;
          } while ((uVar16 + 8 & 0x1fffffff8) != uVar17);
          auVar77 = vorps_avx(auVar68,auVar76);
          auVar88._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
          auVar88._12_4_ = auVar104._12_4_ ^ 0x80000000;
          auVar77 = vpcmpgtq_avx(auVar88,auVar77);
          auVar69 = vpackssdw_avx(auVar77,auVar91);
          auVar77 = vorps_avx(auVar68,auVar76);
          auVar114._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
          auVar114._8_4_ = auVar163._8_4_;
          auVar114._12_4_ = auVar163._12_4_ ^ 0x80000000;
          auVar77 = vpcmpgtq_avx(auVar114,auVar77);
          auVar77 = vpackssdw_avx(auVar77,auVar92);
          auVar77 = vblendvps_avx(auVar115,auVar67,auVar77 ^ auVar79);
          auVar67 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar69 ^ auVar79);
          auVar77 = vhaddps_avx(auVar67,auVar77);
          auVar77 = vhaddps_avx(auVar77,auVar77);
          auVar67 = vhaddps_avx(auVar77,auVar77);
        }
        auVar67 = vfmadd213ss_fma(auVar67,ZEXT416((uint)(1.0 / (float)(int)uVar9)),
                                  ZEXT416(*(uint *)(&this->field_0xd8 + (long)p_Var2)));
        auVar77 = vrsqrtss_avx(auVar67,auVar67);
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar77._0_4_)),auVar77,
                                  ZEXT416(0xc0400000));
        auVar160 = ZEXT1664(auVar67);
        fVar142 = auVar77._0_4_ * -0.5 * auVar67._0_4_;
        fVar140 = fVar142 * -fVar140;
        auVar69 = ZEXT416((uint)fVar142);
        auVar77 = vshufps_avx(auVar69,auVar69,0);
        auVar170._16_16_ = auVar77;
        auVar170._0_16_ = auVar77;
        auVar67 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
        auVar179._16_16_ = auVar67;
        auVar179._0_16_ = auVar67;
        if (*(int *)(&this->field_0xdc + (long)p_Var2) == 0) {
          uVar20 = 0;
          if (7 < (int)uVar9) {
            iVar13 = 7;
            do {
              auVar69 = vfmadd132ps_fma(*pauVar25,auVar179,auVar170);
              *pauVar25 = ZEXT1632(auVar69);
              pauVar25 = pauVar25 + 1;
              iVar13 = iVar13 + 8;
              uVar20 = uVar18;
            } while (iVar13 < (int)uVar9);
          }
          uVar14 = uVar20 | 3;
          while ((int)uVar14 < (int)uVar9) {
            auVar69 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar67,auVar77);
            *(undefined1 (*) [16])*pauVar25 = auVar69;
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
            uVar14 = uVar20 + 7;
            uVar20 = uVar20 + 4;
          }
          if ((int)uVar20 < (int)uVar9) {
            uVar17 = CONCAT44(0,~uVar20 + uVar9);
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar17;
            auVar69 = vpshufd_avx(auVar31,0x44);
            auVar135._16_16_ = auVar77;
            auVar135._0_16_ = auVar77;
            auVar155._16_16_ = auVar67;
            auVar155._0_16_ = auVar67;
            auVar77 = vorps_avx(auVar69,auVar76);
            auVar67 = vorps_avx(auVar69,auVar76);
            uVar16 = 0;
            do {
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar16;
              auVar68 = vpshufd_avx(auVar32,0x44);
              auVar53._16_16_ = auVar68;
              auVar53._0_16_ = auVar68;
              auVar163 = vorps_avx(auVar53,auVar5);
              auVar104 = vorps_avx(auVar53,auVar6);
              auVar68 = vorps_avx(auVar69,auVar76);
              auVar124._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
              auVar124._8_4_ = auVar104._24_4_;
              auVar124._12_4_ = auVar104._28_4_ ^ 0x80000000;
              auVar90 = vpcmpgtq_avx(auVar124,auVar68);
              auVar33._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
              auVar33._8_4_ = auVar104._8_4_;
              auVar33._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar33,auVar77);
              auVar90 = vpackssdw_avx(auVar91,auVar90);
              auVar125._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
              auVar125._8_4_ = auVar163._24_4_;
              auVar125._12_4_ = auVar163._28_4_ ^ 0x80000000;
              auVar68 = vpcmpgtq_avx(auVar125,auVar68);
              auVar89._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
              auVar89._8_4_ = auVar163._8_4_;
              auVar89._12_4_ = auVar163._12_4_ ^ 0x80000000;
              auVar91 = vpcmpgtq_avx(auVar89,auVar67);
              auVar68 = vpackssdw_avx(auVar91,auVar68);
              auVar68 = vpackssdw_avx(auVar68 ^ auVar79,auVar90 ^ auVar79);
              auVar90 = vpmovsxwd_avx(auVar68);
              auVar68 = vpunpckhwd_avx(auVar68,auVar68);
              auVar54._16_16_ = auVar68;
              auVar54._0_16_ = auVar90;
              auVar163 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])(*pauVar25 + uVar16 * 4));
              auVar68 = vfmadd213ps_fma(auVar163,auVar135,auVar155);
              auVar163 = vmaskmovps_avx(auVar54,ZEXT1632(auVar68));
              *(undefined1 (*) [32])(*pauVar25 + uVar16 * 4) = auVar163;
              uVar16 = uVar16 + 8;
            } while ((uVar17 + 8 & 0x1fffffff8) != uVar16);
          }
        }
        else {
          pauVar12 = (undefined1 (*) [32])
                     (*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar10 +
                     *(long *)(&this->field_0xe0 + (long)p_Var2));
          pauVar11 = (undefined1 (*) [32])
                     (lVar10 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                     *(long *)(&this->field_0x128 + (long)p_Var2));
          fVar142 = auVar77._0_4_;
          fVar131 = auVar77._4_4_;
          fVar139 = auVar77._8_4_;
          uVar20 = 0;
          if (7 < (int)uVar9) {
            iVar13 = 7;
            do {
              auVar163 = *pauVar12;
              auVar161._0_4_ = fVar142 * auVar163._0_4_;
              auVar161._4_4_ = fVar131 * auVar163._4_4_;
              auVar161._8_4_ = fVar139 * auVar163._8_4_;
              auVar161._12_4_ = auVar77._12_4_ * auVar163._12_4_;
              auVar161._16_4_ = fVar142 * auVar163._16_4_;
              auVar161._20_4_ = fVar131 * auVar163._20_4_;
              auVar161._28_36_ = auVar160._28_36_;
              auVar161._24_4_ = fVar139 * auVar163._24_4_;
              auVar160 = ZEXT3264(auVar161._0_32_);
              auVar68 = vfmadd213ps_fma(auVar163,auVar179,*pauVar11);
              auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar161._0_32_,*pauVar25);
              *pauVar25 = ZEXT1632(auVar68);
              pauVar12 = pauVar12 + 1;
              pauVar11 = pauVar11 + 1;
              pauVar25 = pauVar25 + 1;
              iVar13 = iVar13 + 8;
              uVar20 = uVar18;
            } while (iVar13 < (int)uVar9);
          }
          uVar14 = uVar20 | 3;
          while ((int)uVar14 < (int)uVar9) {
            auVar68 = *(undefined1 (*) [16])*pauVar12;
            auVar66._0_4_ = fVar142 * auVar68._0_4_;
            auVar66._4_4_ = fVar131 * auVar68._4_4_;
            auVar66._8_4_ = fVar139 * auVar68._8_4_;
            auVar66._12_4_ = auVar77._12_4_ * auVar68._12_4_;
            auVar68 = vfmadd213ps_fma(auVar68,auVar67,*(undefined1 (*) [16])*pauVar11);
            auVar68 = vfmadd231ps_fma(auVar68,auVar66,*(undefined1 (*) [16])*pauVar25);
            *(undefined1 (*) [16])*pauVar25 = auVar68;
            pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
            pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
            uVar14 = uVar20 + 7;
            uVar20 = uVar20 + 4;
          }
          if ((int)uVar20 < (int)uVar9) {
            lVar10 = 0;
            do {
              auVar77 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar25 + lVar10 * 4)),
                                        ZEXT416((uint)fVar140),auVar69);
              auVar77 = vfmadd213ss_fma(auVar77,ZEXT416(*(uint *)(*pauVar12 + lVar10 * 4)),
                                        ZEXT416(*(uint *)(*pauVar11 + lVar10 * 4)));
              *(int *)(*pauVar25 + lVar10 * 4) = auVar77._0_4_;
              lVar10 = lVar10 + 1;
            } while (uVar9 - uVar20 != (int)lVar10);
          }
        }
        lVar22 = lVar22 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar22 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  else if (iVar13 - 3U < 2) {
    pp_Var1 = this->_vptr_GroupNorm_x86_fma;
    p_Var2 = pp_Var1[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var2)) {
      uVar20 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
      pp_Var3 = this->_vptr_GroupNorm_x86_fma;
      uVar18 = uVar20 & 0xfffffff8;
      fVar140 = 1.0 / (float)(int)(uVar20 * uVar9);
      lVar22 = 0;
      auVar78._8_8_ = 0x8000000000000000;
      auVar78._0_8_ = 0x8000000000000000;
      auVar79 = vpcmpeqd_avx(auVar79,auVar79);
      do {
        lVar27 = lVar22 * (int)uVar9;
        uVar17 = bottom_top_blob->elemsize;
        lVar10 = bottom_top_blob->cstep * lVar27 * uVar17;
        pvVar4 = bottom_top_blob->data;
        uVar7 = ((long)bottom_top_blob->d * uVar17 *
                 (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
                uVar17;
        auVar77 = ZEXT816(0) << 0x40;
        auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
        fVar142 = 0.0;
        if (0 < (int)uVar9) {
          uVar26 = 0;
          do {
            pfVar8 = (float *)((long)pvVar4 + uVar7 * uVar17 * uVar26 + lVar10);
            if ((int)uVar20 < 8) {
              auVar158 = SUB6432(ZEXT864(0),0);
              uVar14 = 0;
            }
            else {
              auVar161 = ZEXT864(0);
              iVar13 = 7;
              do {
                auVar158._0_4_ = auVar161._0_4_ + *pfVar8;
                auVar158._4_4_ = auVar161._4_4_ + pfVar8[1];
                auVar158._8_4_ = auVar161._8_4_ + pfVar8[2];
                auVar158._12_4_ = auVar161._12_4_ + pfVar8[3];
                auVar158._16_4_ = auVar161._16_4_ + pfVar8[4];
                auVar158._20_4_ = auVar161._20_4_ + pfVar8[5];
                auVar158._24_4_ = auVar161._24_4_ + pfVar8[6];
                auVar158._28_4_ = auVar161._28_4_ + pfVar8[7];
                auVar161 = ZEXT3264(auVar158);
                pfVar8 = pfVar8 + 8;
                iVar13 = iVar13 + 8;
                uVar14 = uVar18;
              } while (iVar13 < (int)uVar20);
            }
            uVar21 = uVar14 | 3;
            auVar128 = ZEXT816(0) << 0x40;
            while( true ) {
              fVar142 = auVar128._4_4_;
              fVar131 = auVar128._8_4_;
              fVar139 = auVar128._12_4_;
              if ((int)uVar20 <= (int)uVar21) break;
              auVar128._0_4_ = auVar128._0_4_ + *pfVar8;
              auVar128._4_4_ = fVar142 + pfVar8[1];
              auVar128._8_4_ = fVar131 + pfVar8[2];
              auVar128._12_4_ = fVar139 + pfVar8[3];
              pfVar8 = pfVar8 + 4;
              uVar21 = uVar14 + 7;
              uVar14 = uVar14 + 4;
            }
            auVar39._0_4_ = auVar158._0_4_ + auVar158._16_4_;
            auVar39._4_4_ = auVar158._4_4_ + auVar158._20_4_;
            auVar39._8_4_ = auVar158._8_4_ + auVar158._24_4_;
            auVar39._12_4_ = auVar158._12_4_ + auVar158._28_4_;
            auVar67 = vshufpd_avx(auVar39,auVar39,1);
            auVar40._0_4_ = auVar67._0_4_ + auVar39._0_4_;
            auVar40._4_4_ = auVar67._4_4_ + auVar39._4_4_;
            auVar40._8_4_ = auVar67._8_4_ + auVar39._8_4_;
            auVar40._12_4_ = auVar67._12_4_ + auVar39._12_4_;
            auVar67 = vmovshdup_avx(auVar40);
            auVar69 = vshufpd_avx(auVar128,auVar128,1);
            auVar120._0_4_ = auVar128._0_4_ + auVar69._0_4_;
            auVar120._4_4_ = fVar142 + auVar69._4_4_;
            auVar120._8_4_ = fVar131 + auVar69._8_4_;
            auVar120._12_4_ = fVar139 + auVar69._12_4_;
            auVar69 = vmovshdup_avx(auVar120);
            fVar142 = auVar69._0_4_ +
                      auVar160._0_4_ + auVar67._0_4_ + auVar40._0_4_ + auVar120._0_4_;
            auVar160 = ZEXT464((uint)fVar142);
            if ((int)uVar14 < (int)uVar20) {
              uVar24 = CONCAT44(0,~uVar14 + uVar20);
              auVar67 = vblendps_avx(ZEXT416((uint)fVar142),_DAT_00594040,0xe);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = uVar24;
              auVar90 = vpshufd_avx(auVar41,0x44);
              auVar69 = vorps_avx(auVar90,auVar78);
              auVar68 = vorps_avx(auVar90,auVar78);
              uVar23 = 0;
              auVar160 = ZEXT1664(auVar67);
              do {
                auVar161 = auVar160;
                auVar42._8_8_ = 0;
                auVar42._0_8_ = uVar23;
                auVar67 = vpshufd_avx(auVar42,0x44);
                auVar58._16_16_ = auVar67;
                auVar58._0_16_ = auVar67;
                auVar163 = vorps_avx(auVar58,auVar5);
                auVar104 = vorps_avx(auVar58,auVar6);
                auVar67 = vorps_avx(auVar90,auVar78);
                auVar43._8_4_ = auVar104._24_4_;
                auVar43._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
                auVar43._12_4_ = auVar104._28_4_ ^ 0x80000000;
                auVar92 = vpcmpgtq_avx(auVar43,auVar67);
                auVar100._8_4_ = auVar104._8_4_;
                auVar176._8_4_ = auVar100._8_4_;
                auVar176._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
                auVar176._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar91 = vpcmpgtq_avx(auVar176,auVar69);
                auVar91 = vpackssdw_avx(auVar91,auVar92);
                auVar181._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
                auVar181._8_4_ = auVar163._24_4_;
                auVar181._12_4_ = auVar163._28_4_ ^ 0x80000000;
                auVar115 = vpcmpgtq_avx(auVar181,auVar67);
                auVar182._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
                auVar182._8_4_ = auVar163._8_4_;
                auVar182._12_4_ = auVar163._12_4_ ^ 0x80000000;
                auVar67 = vpcmpgtq_avx(auVar182,auVar68);
                auVar67 = vpackssdw_avx(auVar67,auVar115);
                auVar67 = vpackssdw_avx(auVar67 ^ auVar79,auVar91 ^ auVar79);
                auVar91 = vpmovsxwd_avx(auVar67);
                auVar67 = vpunpckhwd_avx(auVar67,auVar67);
                auVar180._16_16_ = auVar67;
                auVar180._0_16_ = auVar91;
                auVar171 = vmaskmovps_avx(auVar180,*(undefined1 (*) [32])(pfVar8 + uVar23));
                auVar154._0_4_ = auVar171._0_4_ + auVar161._0_4_;
                auVar154._4_4_ = auVar171._4_4_ + auVar161._4_4_;
                auVar154._8_4_ = auVar171._8_4_ + auVar161._8_4_;
                auVar154._12_4_ = auVar171._12_4_ + auVar161._12_4_;
                auVar157._16_4_ = auVar171._16_4_ + auVar161._16_4_;
                auVar157._0_16_ = auVar154;
                auVar157._20_4_ = auVar171._20_4_ + auVar161._20_4_;
                auVar157._24_4_ = auVar171._24_4_ + auVar161._24_4_;
                auVar157._28_4_ = auVar171._28_4_ + auVar161._28_4_;
                uVar23 = uVar23 + 8;
                auVar160 = ZEXT3264(auVar157);
              } while ((uVar24 + 8 & 0x1fffffff8) != uVar23);
              auVar67 = vorps_avx(auVar90,auVar78);
              auVar100._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
              auVar100._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar67 = vpcmpgtq_avx(auVar100,auVar67);
              auVar69 = vpackssdw_avx(auVar67,auVar92);
              auVar67 = vorps_avx(auVar90,auVar78);
              auVar129._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
              auVar129._8_4_ = auVar163._8_4_;
              auVar129._12_4_ = auVar163._12_4_ ^ 0x80000000;
              auVar67 = vpcmpgtq_avx(auVar129,auVar67);
              auVar67 = vpackssdw_avx(auVar67,auVar115);
              auVar67 = vblendvps_avx(auVar161._0_16_,auVar154,auVar67 ^ auVar79);
              auVar69 = vblendvps_avx(auVar161._16_16_,auVar157._16_16_,auVar69 ^ auVar79);
              auVar67 = vhaddps_avx(auVar69,auVar67);
              auVar67 = vhaddps_avx(auVar67,auVar67);
              auVar67 = vhaddps_avx(auVar67,auVar67);
              auVar160 = ZEXT1664(auVar67);
            }
            fVar142 = auVar160._0_4_;
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar16);
        }
        pfVar8 = (float *)(*(long *)(&this->field_0xf0 + (long)p_Var2) * lVar27 +
                          *(long *)(&this->field_0xe0 + (long)p_Var2));
        puVar28 = (uint *)(lVar27 * *(long *)(&this->field_0x138 + (long)p_Var2) +
                          *(long *)(&this->field_0x128 + (long)p_Var2));
        fVar142 = fVar142 * fVar140;
        if (0 < (int)uVar9) {
          auVar67 = vpermilps_avx(ZEXT416((uint)fVar142),0);
          auVar164._16_16_ = auVar67;
          auVar164._0_16_ = auVar67;
          auVar160 = ZEXT464(0) << 0x40;
          uVar26 = 0;
          do {
            pauVar25 = (undefined1 (*) [32])((long)pvVar4 + uVar7 * uVar17 * uVar26 + lVar10);
            if ((int)uVar20 < 8) {
              auVar163 = SUB6432(ZEXT864(0),0);
              uVar14 = 0;
            }
            else {
              auVar161 = ZEXT864(0);
              iVar13 = 7;
              do {
                auVar163 = vsubps_avx(*pauVar25,auVar164);
                auVar77 = vfmadd231ps_fma(auVar161._0_32_,auVar163,auVar163);
                auVar161 = ZEXT1664(auVar77);
                auVar163 = ZEXT1632(auVar77);
                pauVar25 = pauVar25 + 1;
                iVar13 = iVar13 + 8;
                uVar14 = uVar18;
              } while (iVar13 < (int)uVar20);
            }
            auVar77 = ZEXT816(0) << 0x40;
            uVar21 = uVar14 | 3;
            while ((int)uVar21 < (int)uVar20) {
              auVar69 = vsubps_avx(*(undefined1 (*) [16])*pauVar25,auVar67);
              auVar77 = vfmadd231ps_fma(auVar77,auVar69,auVar69);
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
              uVar21 = uVar14 + 7;
              uVar14 = uVar14 + 4;
            }
            auVar44._0_4_ = auVar163._0_4_ + auVar163._16_4_;
            auVar44._4_4_ = auVar163._4_4_ + auVar163._20_4_;
            auVar44._8_4_ = auVar163._8_4_ + auVar163._24_4_;
            auVar44._12_4_ = auVar163._12_4_ + auVar163._28_4_;
            auVar69 = vshufpd_avx(auVar44,auVar44,1);
            auVar45._0_4_ = auVar69._0_4_ + auVar44._0_4_;
            auVar45._4_4_ = auVar69._4_4_ + auVar44._4_4_;
            auVar45._8_4_ = auVar69._8_4_ + auVar44._8_4_;
            auVar45._12_4_ = auVar69._12_4_ + auVar44._12_4_;
            auVar69 = vmovshdup_avx(auVar45);
            auVar68 = vshufpd_avx(auVar77,auVar77,1);
            auVar121._0_4_ = auVar77._0_4_ + auVar68._0_4_;
            auVar121._4_4_ = auVar77._4_4_ + auVar68._4_4_;
            auVar121._8_4_ = auVar77._8_4_ + auVar68._8_4_;
            auVar121._12_4_ = auVar77._12_4_ + auVar68._12_4_;
            auVar77 = vmovshdup_avx(auVar121);
            fVar131 = auVar77._0_4_ +
                      auVar160._0_4_ + auVar69._0_4_ + auVar45._0_4_ + auVar121._0_4_;
            auVar160 = ZEXT464((uint)fVar131);
            if ((int)uVar14 < (int)uVar20) {
              uVar24 = CONCAT44(0,~uVar14 + uVar20);
              auVar77 = vblendps_avx(ZEXT416((uint)fVar131),_DAT_00594040,0xe);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = uVar24;
              auVar90 = vpshufd_avx(auVar46,0x44);
              auVar69 = vorps_avx(auVar90,auVar78);
              auVar68 = vorps_avx(auVar90,auVar78);
              uVar23 = 0;
              do {
                auVar93 = auVar77;
                auVar47._8_8_ = 0;
                auVar47._0_8_ = uVar23;
                auVar77 = vpshufd_avx(auVar47,0x44);
                auVar59._16_16_ = auVar77;
                auVar59._0_16_ = auVar77;
                auVar163 = vorps_avx(auVar59,auVar5);
                auVar104 = vorps_avx(auVar59,auVar6);
                auVar77 = vorps_avx(auVar90,auVar78);
                auVar48._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
                auVar48._8_4_ = auVar104._24_4_;
                auVar48._12_4_ = auVar104._28_4_ ^ 0x80000000;
                auVar92 = vpcmpgtq_avx(auVar48,auVar77);
                auVar168._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
                auVar122._8_4_ = auVar104._8_4_;
                auVar168._8_4_ = auVar122._8_4_;
                auVar168._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar91 = vpcmpgtq_avx(auVar168,auVar69);
                auVar91 = vpackssdw_avx(auVar91,auVar92);
                auVar70._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
                auVar70._8_4_ = auVar163._24_4_;
                auVar70._12_4_ = auVar163._28_4_ ^ 0x80000000;
                auVar115 = vpcmpgtq_avx(auVar70,auVar77);
                auVar71._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
                auVar71._8_4_ = auVar163._8_4_;
                auVar71._12_4_ = auVar163._12_4_ ^ 0x80000000;
                auVar77 = vpcmpgtq_avx(auVar71,auVar68);
                auVar77 = vpackssdw_avx(auVar77,auVar115);
                auVar77 = vpackssdw_avx(auVar77 ^ auVar79,auVar91 ^ auVar79);
                auVar91 = vpmovsxwd_avx(auVar77);
                auVar77 = vpunpckhwd_avx(auVar77,auVar77);
                auVar75._16_16_ = auVar77;
                auVar75._0_16_ = auVar91;
                auVar171 = vmaskmovps_avx(auVar75,*(undefined1 (*) [32])(*pauVar25 + uVar23 * 4));
                auVar171 = vsubps_avx(auVar171,auVar164);
                auVar77 = vfmadd213ps_fma(auVar171,auVar171,ZEXT1632(auVar93));
                uVar23 = uVar23 + 8;
              } while ((uVar24 + 8 & 0x1fffffff8) != uVar23);
              auVar69 = vorps_avx(auVar90,auVar78);
              auVar122._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
              auVar122._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar122,auVar69);
              auVar68 = vpackssdw_avx(auVar69,auVar92);
              auVar69 = vorps_avx(auVar90,auVar78);
              auVar123._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
              auVar123._8_4_ = auVar163._8_4_;
              auVar123._12_4_ = auVar163._12_4_ ^ 0x80000000;
              auVar69 = vpcmpgtq_avx(auVar123,auVar69);
              auVar69 = vpackssdw_avx(auVar69,auVar115);
              auVar77 = vblendvps_avx(auVar93,auVar77,auVar69 ^ auVar79);
              auVar69 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar68 ^ auVar79)
              ;
              auVar77 = vhaddps_avx(auVar69,auVar77);
              auVar77 = vhaddps_avx(auVar77,auVar77);
              auVar77 = vhaddps_avx(auVar77,auVar77);
              auVar160 = ZEXT1664(auVar77);
            }
            auVar77 = auVar160._0_16_;
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar16);
        }
        auVar67 = vfmadd213ss_fma(auVar77,ZEXT416((uint)fVar140),
                                  ZEXT416(*(uint *)(&this->field_0xd8 + (long)pp_Var3[-3])));
        auVar77 = vrsqrtss_avx(auVar67,auVar67);
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(auVar67._0_4_ * auVar77._0_4_)),auVar77,
                                  ZEXT416(0xc0400000));
        if (0 < (int)uVar9) {
          fVar131 = auVar77._0_4_ * -0.5 * auVar67._0_4_;
          uVar26 = 0;
          do {
            auVar77 = ZEXT416((uint)(fVar131 * -fVar142));
            fVar139 = fVar131;
            if (*(int *)(&this->field_0xdc + (long)pp_Var3[-3]) != 0) {
              fVar139 = fVar131 * *pfVar8;
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)*pfVar8),auVar77,ZEXT416(*puVar28));
            }
            pauVar25 = (undefined1 (*) [32])((long)pvVar4 + uVar7 * uVar17 * uVar26 + lVar10);
            auVar67 = vshufps_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139),0);
            auVar77 = vshufps_avx(auVar77,auVar77,0);
            uVar14 = 0;
            if (7 < (int)uVar20) {
              auVar60._16_16_ = auVar67;
              auVar60._0_16_ = auVar67;
              auVar109._16_16_ = auVar77;
              auVar109._0_16_ = auVar77;
              iVar13 = 7;
              do {
                auVar69 = vfmadd132ps_fma(*pauVar25,auVar109,auVar60);
                *pauVar25 = ZEXT1632(auVar69);
                pauVar25 = pauVar25 + 1;
                iVar13 = iVar13 + 8;
                uVar14 = uVar18;
              } while (iVar13 < (int)uVar20);
            }
            uVar21 = uVar14 | 3;
            while ((int)uVar21 < (int)uVar20) {
              auVar69 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar77,auVar67);
              *(undefined1 (*) [16])*pauVar25 = auVar69;
              pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
              uVar21 = uVar14 + 7;
              uVar14 = uVar14 + 4;
            }
            if ((int)uVar14 < (int)uVar20) {
              uVar23 = CONCAT44(0,~uVar14 + uVar20);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = uVar23;
              auVar69 = vpshufd_avx(auVar49,0x44);
              auVar165._16_16_ = auVar67;
              auVar165._0_16_ = auVar67;
              auVar159._16_16_ = auVar77;
              auVar159._0_16_ = auVar77;
              auVar77 = vorps_avx(auVar69,auVar78);
              auVar67 = vorps_avx(auVar69,auVar78);
              uVar24 = 0;
              do {
                auVar50._8_8_ = 0;
                auVar50._0_8_ = uVar24;
                auVar68 = vpshufd_avx(auVar50,0x44);
                auVar61._16_16_ = auVar68;
                auVar61._0_16_ = auVar68;
                auVar163 = vorps_avx(auVar61,auVar5);
                auVar104 = vorps_avx(auVar61,auVar6);
                auVar68 = vorps_avx(auVar69,auVar78);
                auVar177._0_8_ = auVar104._16_8_ ^ 0x8000000000000000;
                auVar177._8_4_ = auVar104._24_4_;
                auVar177._12_4_ = auVar104._28_4_ ^ 0x80000000;
                auVar90 = vpcmpgtq_avx(auVar177,auVar68);
                auVar51._0_8_ = auVar104._0_8_ ^ 0x8000000000000000;
                auVar51._8_4_ = auVar104._8_4_;
                auVar51._12_4_ = auVar104._12_4_ ^ 0x80000000;
                auVar91 = vpcmpgtq_avx(auVar51,auVar77);
                auVar90 = vpackssdw_avx(auVar91,auVar90);
                auVar178._0_8_ = auVar163._16_8_ ^ 0x8000000000000000;
                auVar178._8_4_ = auVar163._24_4_;
                auVar178._12_4_ = auVar163._28_4_ ^ 0x80000000;
                auVar68 = vpcmpgtq_avx(auVar178,auVar68);
                auVar72._0_8_ = auVar163._0_8_ ^ 0x8000000000000000;
                auVar72._8_4_ = auVar163._8_4_;
                auVar72._12_4_ = auVar163._12_4_ ^ 0x80000000;
                auVar91 = vpcmpgtq_avx(auVar72,auVar67);
                auVar68 = vpackssdw_avx(auVar91,auVar68);
                auVar68 = vpackssdw_avx(auVar68 ^ auVar79,auVar90 ^ auVar79);
                auVar90 = vpmovsxwd_avx(auVar68);
                auVar68 = vpunpckhwd_avx(auVar68,auVar68);
                auVar62._16_16_ = auVar68;
                auVar62._0_16_ = auVar90;
                auVar163 = vmaskmovps_avx(auVar62,*(undefined1 (*) [32])(*pauVar25 + uVar24 * 4));
                auVar68 = vfmadd213ps_fma(auVar163,auVar165,auVar159);
                auVar163 = vmaskmovps_avx(auVar62,ZEXT1632(auVar68));
                *(undefined1 (*) [32])(*pauVar25 + uVar24 * 4) = auVar163;
                uVar24 = uVar24 + 8;
              } while ((uVar23 + 8 & 0x1fffffff8) != uVar24);
            }
            pfVar8 = pfVar8 + 1;
            puVar28 = puVar28 + 1;
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar16);
        }
        lVar22 = lVar22 + 1;
        p_Var2 = pp_Var1[-3];
      } while (lVar22 < *(int *)(&this->field_0xd0 + (long)p_Var2));
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}